

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  GetterXsYs<float> *pGVar4;
  TransformerLinLog *pTVar5;
  ImPlotPlot *pIVar6;
  GetterXsYRef<float> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  double dVar10;
  undefined1 auVar11 [12];
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  ushort uVar16;
  ImDrawIdx IVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar39 [16];
  
  pIVar12 = GImPlot;
  pGVar4 = this->Getter1;
  pTVar5 = this->Transformer;
  iVar14 = pGVar4->Count;
  lVar15 = (long)(((pGVar4->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar4->Stride;
  fVar29 = *(float *)((long)pGVar4->Xs + lVar15);
  dVar10 = log10((double)*(float *)((long)pGVar4->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar5->YAxis].Range.Min);
  pIVar13 = GImPlot;
  iVar14 = pTVar5->YAxis;
  pIVar6 = pIVar12->CurrentPlot;
  dVar1 = pIVar6->YAxis[iVar14].Range.Min;
  pGVar7 = this->Getter2;
  pTVar5 = this->Transformer;
  iVar3 = pGVar7->Count;
  fVar23 = *(float *)((long)pGVar7->Xs +
                     (long)(((prim + 1 + pGVar7->Offset) % iVar3 + iVar3) % iVar3) *
                     (long)pGVar7->Stride);
  IVar2 = pIVar12->PixelRange[iVar14].Min;
  fVar25 = (float)(pIVar12->Mx * ((double)fVar29 - (pIVar6->XAxis).Range.Min) + (double)IVar2.x);
  fVar27 = (float)(pIVar12->My[iVar14] *
                   (((double)(float)(dVar10 / pIVar12->LogDenY[iVar14]) *
                     (pIVar6->YAxis[iVar14].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  dVar10 = log10(pGVar7->YRef / GImPlot->CurrentPlot->YAxis[pTVar5->YAxis].Range.Min);
  iVar14 = pTVar5->YAxis;
  pIVar6 = pIVar13->CurrentPlot;
  dVar1 = pIVar6->YAxis[iVar14].Range.Min;
  IVar2 = pIVar13->PixelRange[iVar14].Min;
  fVar23 = (float)(pIVar13->Mx * ((double)fVar23 - (pIVar6->XAxis).Range.Min) + (double)IVar2.x);
  fVar24 = (float)(pIVar13->My[iVar14] *
                   (((double)(float)(dVar10 / pIVar13->LogDenY[iVar14]) *
                     (pIVar6->YAxis[iVar14].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar26 = (this->P12).x;
  fVar28 = (this->P12).y;
  fVar30 = (this->P11).y;
  fVar35 = (this->P11).x;
  uVar21 = -(uint)(fVar30 < fVar28);
  fVar29 = (float)(~-(uint)(fVar26 <= fVar35) & (uint)fVar26 |
                  (uint)fVar35 & -(uint)(fVar26 <= fVar35));
  fVar31 = (float)(~-(uint)(fVar28 <= fVar30) & (uint)fVar28 |
                  (uint)fVar30 & -(uint)(fVar28 <= fVar30));
  fVar34 = (float)(~-(uint)(fVar35 < fVar26) & (uint)fVar26 |
                  (uint)fVar35 & -(uint)(fVar35 < fVar26));
  fVar43 = (float)(~uVar21 & (uint)fVar28 | (uint)fVar30 & uVar21);
  uVar18 = -(uint)(fVar25 <= fVar29);
  uVar19 = -(uint)(fVar27 <= fVar31);
  uVar20 = -(uint)(fVar34 < fVar25);
  uVar22 = -(uint)(fVar43 < fVar27);
  fVar29 = (float)(~uVar18 & (uint)fVar25 | (uint)fVar29 & uVar18);
  fVar31 = (float)(~uVar19 & (uint)fVar27 | (uint)fVar31 & uVar19);
  fVar34 = (float)(~uVar20 & (uint)fVar25 | (uint)fVar34 & uVar20);
  fVar43 = (float)(~uVar22 & (uint)fVar27 | (uint)fVar43 & uVar22);
  uVar18 = -(uint)(fVar23 <= fVar29);
  uVar19 = -(uint)(fVar24 <= fVar31);
  uVar20 = -(uint)(fVar34 < fVar23);
  uVar22 = -(uint)(fVar43 < fVar24);
  auVar33._0_4_ = (uint)fVar29 & uVar18;
  auVar33._4_4_ = (uint)fVar31 & uVar19;
  auVar33._8_4_ = (uint)fVar34 & uVar20;
  auVar33._12_4_ = (uint)fVar43 & uVar22;
  auVar40._0_4_ = ~uVar18 & (uint)fVar23;
  auVar40._4_4_ = ~uVar19 & (uint)fVar24;
  auVar40._8_4_ = ~uVar20 & (uint)fVar23;
  auVar40._12_4_ = ~uVar22 & (uint)fVar24;
  auVar40 = auVar40 | auVar33;
  fVar29 = (cull_rect->Min).y;
  auVar42._4_4_ = -(uint)(fVar29 < auVar40._4_4_);
  auVar42._0_4_ = -(uint)((cull_rect->Min).x < auVar40._0_4_);
  auVar11._4_8_ = auVar40._8_8_;
  auVar11._0_4_ = -(uint)(auVar40._4_4_ < fVar29);
  auVar41._0_8_ = auVar11._0_8_ << 0x20;
  auVar41._8_4_ = -(uint)(auVar40._8_4_ < (cull_rect->Max).x);
  auVar41._12_4_ = -(uint)(auVar40._12_4_ < (cull_rect->Max).y);
  auVar42._8_8_ = auVar41._8_8_;
  iVar14 = movmskps((int)cull_rect,auVar42);
  if (iVar14 == 0xf) {
    fVar31 = fVar27 * fVar35 - fVar30 * fVar25;
    fVar34 = fVar24 * fVar26 - fVar28 * fVar23;
    fVar29 = fVar28 - fVar24;
    auVar36._4_4_ = fVar29;
    auVar36._0_4_ = fVar29;
    auVar36._8_4_ = fVar29;
    auVar36._12_4_ = fVar29;
    auVar37._4_12_ = auVar36._4_12_;
    auVar37._0_4_ = fVar29 * (fVar35 - fVar25) - (fVar30 - fVar27) * (fVar26 - fVar23);
    auVar32._0_4_ = fVar31 * (fVar26 - fVar23) - fVar34 * (fVar35 - fVar25);
    auVar32._4_4_ = fVar31 * fVar29 - fVar34 * (fVar30 - fVar27);
    auVar32._8_4_ = fVar27 * 0.0 - fVar24 * 0.0;
    auVar32._12_4_ = fVar27 * 0.0 - fVar24 * 0.0;
    auVar39._0_8_ = auVar37._0_8_;
    auVar39._8_4_ = fVar29;
    auVar39._12_4_ = fVar29;
    auVar38._8_8_ = auVar39._8_8_;
    auVar38._4_4_ = auVar37._0_4_;
    auVar38._0_4_ = auVar37._0_4_;
    auVar33 = divps(auVar32,auVar38);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = this->Col;
    pIVar8[1].pos.x = fVar25;
    pIVar8[1].pos.y = fVar27;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = this->Col;
    pIVar8[2].pos = auVar33._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = this->Col;
    pIVar8[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = this->Col;
    IVar2.y = fVar24;
    IVar2.x = fVar23;
    pIVar8[4].pos = IVar2;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar8 + 5;
    uVar18 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar18;
    *pIVar9 = IVar17;
    uVar16 = (byte)((byte)uVar21 & fVar24 < fVar27 | -(fVar28 < fVar30) & -(fVar27 < fVar24)) & 1;
    pIVar9[1] = IVar17 + uVar16 + 1;
    pIVar9[2] = IVar17 + 3;
    pIVar9[3] = IVar17 + 1;
    pIVar9[4] = (uVar16 ^ 3) + IVar17;
    pIVar9[5] = IVar17 + 4;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar18 + 5;
  }
  (this->P11).x = fVar25;
  (this->P11).y = fVar27;
  (this->P12).x = fVar23;
  (this->P12).y = fVar24;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }